

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O1

void voc_parse_words(char **wrdtxt,int *len,char **wrd2,int *len2)

{
  char *pcVar1;
  ushort **ppuVar2;
  int iVar3;
  long lVar4;
  
  *len = *(ushort *)*wrdtxt - 2;
  pcVar1 = *wrdtxt;
  *wrdtxt = pcVar1 + 2;
  *wrd2 = pcVar1 + 2;
  iVar3 = *len;
  *len2 = iVar3;
  do {
    if (iVar3 == 0) {
LAB_002247f7:
      *wrd2 = (char *)0x0;
      return;
    }
    pcVar1 = *wrd2;
    lVar4 = (long)*pcVar1;
    if ((-1 < lVar4) &&
       (ppuVar2 = __ctype_b_loc(), (*(byte *)((long)*ppuVar2 + lVar4 * 2 + 1) & 0x20) != 0)) {
      if (iVar3 != 0) {
        *len = *len - iVar3;
        if (*len2 == 0) {
          return;
        }
        while( true ) {
          pcVar1 = *wrd2;
          lVar4 = (long)*pcVar1;
          if (lVar4 < 0) {
            return;
          }
          ppuVar2 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar2 + lVar4 * 2 + 1) & 0x20) == 0) break;
          *wrd2 = pcVar1 + 1;
          *len2 = *len2 + -1;
          if (*len2 == 0) {
            return;
          }
        }
        return;
      }
      goto LAB_002247f7;
    }
    *wrd2 = pcVar1 + 1;
    iVar3 = *len2 + -1;
    *len2 = iVar3;
  } while( true );
}

Assistant:

static void voc_parse_words(char **wrdtxt, int *len, char **wrd2, int *len2)
{
    /* get length and pointer to actual text */
    *len = osrp2(*wrdtxt) - 2;
    *wrdtxt += 2;
    
    /* see if there's a second word - look for a space */
    for (*wrd2 = *wrdtxt, *len2 = *len ; *len2 && !vocisspace(**wrd2) ;
         ++*wrd2, --*len2) ;
    if (*len2)
    {
        *len -= *len2;
        while (*len2 && vocisspace(**wrd2)) ++*wrd2, --*len2;
    }
    else
    {
        /* no space ==> no second word */
        *wrd2 = (char *)0;
    }
}